

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O0

QP2PassNodeResult __thiscall mp::QP2PassVisitor::VisitDiv(QP2PassVisitor *this,BinaryExpr e)

{
  undefined1 uVar1;
  ExprBase e_00;
  undefined8 uVar2;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> other;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_RDI;
  CStringRef msg;
  pair<bool,_double> pVar3;
  pair<bool,_double> isc;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
  *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  type tVar4;
  ExprBase in_stack_ffffffffffffffa0;
  QP2PassVisitor *in_stack_ffffffffffffffb8;
  BasicCStringRef<char> in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd4;
  undefined7 in_stack_ffffffffffffffd9;
  QP2PassNodeResult local_4;
  
  tVar4 = (type)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  e_00.impl_ = (Impl *)BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
                       ::rhs(in_stack_ffffffffffffff88);
  BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_RDI,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                    in_stack_ffffffffffffffa0.impl_,tVar4);
  pVar3 = IsConst(in_stack_ffffffffffffffb8,(Expr)in_stack_ffffffffffffffc0.data_);
  msg.data_ = (char *)pVar3.second;
  uVar1 = pVar3.first;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_4 = 1000;
  }
  else {
    if (((double)msg.data_ == 0.0) && (!NAN((double)msg.data_))) {
      uVar2 = __cxa_allocate_exception(0x18);
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xffffffffffffffc0,"Division by 0");
      Error::Error((Error *)CONCAT71(in_stack_ffffffffffffffd9,uVar1),msg,in_stack_ffffffffffffffd4)
      ;
      __cxa_throw(uVar2,&Error::typeinfo,Error::~Error);
    }
    other = BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
            ::lhs(in_stack_ffffffffffffff88);
    BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
    BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>(in_RDI,other,tVar4);
    local_4 = Visit((QP2PassVisitor *)in_stack_ffffffffffffffc0.data_,(Expr)e_00.impl_,
                    (double)in_stack_ffffffffffffffb8);
  }
  return local_4;
}

Assistant:

QP2PassNodeResult QP2PassVisitor::VisitDiv(BinaryExpr e) {
  auto isc = IsConst(e.rhs());
  if (isc.first) {
    if (!isc.second)
      MP_RAISE("Division by 0");
    return Visit(e.lhs(), 1.0/isc.second);
  }
  return 1000;
}